

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1518_numBottles.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  iVar1 = numWaterBottles(0xf,4);
  std::ostream::operator<<((ostream *)&std::cout,iVar1);
  return 0;
}

Assistant:

int main()
{
	cout<<numWaterBottles(15,4);
	return 0;
}